

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

Eso_Man_t * Eso_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  Eso_Man_t *pEVar2;
  Vec_Wec_t *pVVar3;
  Hsh_VecMan_t *pHVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pObj;
  bool bVar6;
  Eso_Man_t *p;
  int local_18;
  int Id;
  int n;
  int i;
  Gia_Man_t *pGia_local;
  
  pEVar2 = (Eso_Man_t *)calloc(1,0x40);
  pEVar2->pGia = pGia;
  iVar1 = Gia_ManCiNum(pGia);
  pEVar2->nVars = iVar1;
  pEVar2->Cube1 = 1000000000;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar3 = Vec_WecStart(iVar1);
  pEVar2->vEsops = pVVar3;
  pHVar4 = Hsh_VecManStart(1000);
  pEVar2->pHash = pHVar4;
  iVar1 = Gia_ManCiNum(pGia);
  pVVar3 = Vec_WecStart(iVar1 + 1);
  pEVar2->vCubes = pVVar3;
  iVar1 = Gia_ManCiNum(pGia);
  pVVar5 = Vec_IntAlloc(iVar1);
  pEVar2->vCube1 = pVVar5;
  iVar1 = Gia_ManCiNum(pGia);
  pVVar5 = Vec_IntAlloc(iVar1);
  pEVar2->vCube2 = pVVar5;
  iVar1 = Gia_ManCiNum(pGia);
  pVVar5 = Vec_IntAlloc(iVar1);
  pEVar2->vCube = pVVar5;
  Id = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCis);
    bVar6 = false;
    if (Id < iVar1) {
      pObj = Gia_ManCi(pGia,Id);
      p._4_4_ = Gia_ObjId(pGia,pObj);
      bVar6 = p._4_4_ != 0;
    }
    if (!bVar6) break;
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      pVVar5 = pEVar2->vCube;
      iVar1 = Abc_Var2Lit(Id,local_18);
      Vec_IntFill(pVVar5,1,iVar1);
      Hsh_VecManAdd(pEVar2->pHash,pEVar2->vCube);
    }
    pVVar5 = Vec_WecEntry(pEVar2->vEsops,p._4_4_);
    iVar1 = Abc_Var2Lit(Id,0);
    Vec_IntPush(pVVar5,iVar1);
    Id = Id + 1;
  }
  return pEVar2;
}

Assistant:

Eso_Man_t * Eso_ManAlloc( Gia_Man_t * pGia )
{
    int i, n, Id;
    Eso_Man_t * p = ABC_CALLOC( Eso_Man_t, 1 );
    p->pGia   = pGia;
    p->nVars  = Gia_ManCiNum(pGia);
    p->Cube1  = ABC_INFINITY;
    p->vEsops = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->pHash  = Hsh_VecManStart( 1000 );
    p->vCubes = Vec_WecStart(Gia_ManCiNum(pGia)+1);
    p->vCube1 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube2 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube  = Vec_IntAlloc(Gia_ManCiNum(pGia));
    Gia_ManForEachCiId( pGia, Id, i )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_IntFill( p->vCube, 1, Abc_Var2Lit(i, n) );
            Hsh_VecManAdd( p->pHash, p->vCube );
        }
        Vec_IntPush( Vec_WecEntry(p->vEsops, Id), Abc_Var2Lit(i, 0) );
    }
    return p;
}